

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::TweakSpeeds(APlayerPawn *this,double *forward,double *side)

{
  double dVar1;
  bool bVar2;
  AInventory *this_00;
  double factor;
  double *side_local;
  double *forward_local;
  APlayerPawn *this_local;
  
  if ((this->super_AActor).health <= this->RunHealth) {
    dVar1 = clamp<double>(*forward,-6400.0,6400.0);
    *forward = dVar1;
    dVar1 = clamp<double>(*side,-6144.0,6144.0);
    *side = dVar1;
  }
  if (12800.0 <= ABS(*forward)) {
    *forward = this->ForwardMove2 * *forward;
  }
  else {
    *forward = this->ForwardMove1 * *forward;
  }
  if (10240.0 <= ABS(*side)) {
    *side = this->SideMove2 * *side;
  }
  else {
    *side = this->SideMove1 * *side;
  }
  if ((((this->super_AActor).player)->morphTics == 0) &&
     (bVar2 = TObjPtr<AInventory>::operator!=(&(this->super_AActor).Inventory,(AInventory *)0x0),
     bVar2)) {
    this_00 = TObjPtr<AInventory>::operator->(&(this->super_AActor).Inventory);
    dVar1 = AInventory::GetSpeedFactor(this_00);
    *forward = dVar1 * *forward;
    *side = dVar1 * *side;
  }
  return;
}

Assistant:

void APlayerPawn::TweakSpeeds (double &forward, double &side)
{
	// Strife's player can't run when its health is below 10
	if (health <= RunHealth)
	{
		forward = clamp<double>(forward, -0x1900, 0x1900);
		side = clamp<double>(side, -0x1800, 0x1800);
	}

	// [GRB]
	if (fabs(forward) < 0x3200)
	{
		forward *= ForwardMove1;
	}
	else
	{
		forward *= ForwardMove2;
	}

	if (fabs(side) < 0x2800)
	{
		side *= SideMove1;
	}
	else
	{
		side *= SideMove2;
	}

	if (!player->morphTics && Inventory != NULL)
	{
		double factor = Inventory->GetSpeedFactor ();
		forward *= factor;
		side *= factor;
	}
}